

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
ParserTestDefaultDefaultCycle::~ParserTestDefaultDefaultCycle(ParserTestDefaultDefaultCycle *this)

{
  ParserTestDefaultDefaultCycle *this_local;
  
  ParserTest::~ParserTest(&this->super_ParserTest);
  return;
}

Assistant:

TEST_F(ParserTest, DefaultDefaultCycle) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n  command = cat $in > $out\n"
"build a: cat a\n"));

  string err;
  EXPECT_EQ(0u, state.DefaultNodes(&err).size());
  EXPECT_EQ("could not determine root nodes of build graph", err);
}